

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O1

DecoratorPtrList * __thiscall
Rml::StyleSheet::InstanceDecorators
          (StyleSheet *this,RenderManager *render_manager,DecoratorDeclarationList *declaration_list
          ,PropertySource *source)

{
  size_type sVar1;
  Node *pNVar2;
  pointer pDVar3;
  DecoratorInstancer *pDVar4;
  code *pcVar5;
  bool bVar6;
  size_t sVar7;
  DecoratorPtrList *this_00;
  Node *pNVar8;
  pointer key_00;
  char *pcVar9;
  ulong uVar10;
  RenderManager *pRVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  StyleSheet *this_01;
  String key;
  RenderManager *local_98;
  StyleSheet *pSStack_90;
  shared_ptr<const_Rml::Decorator> local_80;
  PropertySource *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  String *local_48;
  RenderManager *local_40;
  Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *local_38;
  
  local_40 = render_manager;
  if ((InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
       ::rmlui_nonrecursive_entered == '\x01') &&
     (bVar6 = Assert("A method defined as non-recursive was entered twice!",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Debug.h"
                     ,0x75), !bVar6)) {
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
  ::rmlui_nonrecursive_entered = '\x01';
  if (InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
      ::non_cached_decorator_list == '\0') {
    InstanceDecorators();
  }
  local_48 = &declaration_list->value;
  sVar1 = (declaration_list->value)._M_string_length;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (sVar1 == 0) {
    ::std::
    vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ::clear(&InstanceDecorators::non_cached_decorator_list);
  }
  else {
    ::std::__cxx11::string::reserve((ulong)&local_68);
    ::std::__cxx11::string::_M_assign((string *)&local_68);
    ::std::__cxx11::string::push_back((char)&local_68);
    if (source != (PropertySource *)0x0) {
      ::std::__cxx11::string::_M_append((char *)&local_68,(ulong)(source->path)._M_dataplus._M_p);
    }
    sVar7 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)&this->decorator_cache,&local_68);
    pNVar2 = (this->decorator_cache).mKeyVals;
    if (pNVar2 + sVar7 != (Node *)(this->decorator_cache).mInfo) {
      this_00 = &pNVar2[sVar7].mData.second;
      goto LAB_00269718;
    }
  }
  if (sVar1 == 0) {
    this_00 = &InstanceDecorators::non_cached_decorator_list;
  }
  else {
    this_00 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::
              doCreateByKey<std::__cxx11::string_const&,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>>
                        ((Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)&this->decorator_cache,&local_68);
  }
  ::std::
  vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
  ::reserve(this_00,((long)(declaration_list->list).
                           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(declaration_list->list).
                           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  key_00 = (declaration_list->list).
           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (declaration_list->list).
           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (key_00 != pDVar3) {
    local_38 = (Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                *)&this->named_decorator_map;
    do {
      pDVar4 = key_00->instancer;
      if (pDVar4 == (DecoratorInstancer *)0x0) {
        sVar7 = robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::findIdx<std::__cxx11::string>(local_38,&key_00->type);
        pNVar8 = (this->named_decorator_map).mKeyVals + sVar7;
        if (pNVar8 == (Node *)(this->named_decorator_map).mInfo) {
          this_01 = (StyleSheet *)0x0;
          pRVar11 = (RenderManager *)0x0;
        }
        else {
          pDVar4 = (pNVar8->mData).second.instancer;
          local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_40;
          local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
          local_70 = source;
          (*pDVar4->_vptr_DecoratorInstancer[2])
                    (&local_98,pDVar4,&(pNVar8->mData).second,&(pNVar8->mData).second.properties,
                     &local_80);
          this_01 = pSStack_90;
          pRVar11 = local_98;
          local_98 = (RenderManager *)0x0;
          pSStack_90 = (StyleSheet *)0x0;
        }
        if (pRVar11 == (RenderManager *)0x0) {
          pcVar9 = "";
          if (source == (PropertySource *)0x0) {
            uVar10 = 0xffffffff;
          }
          else {
            pcVar9 = (source->path)._M_dataplus._M_p;
            uVar10 = (ulong)(uint)source->line_number;
          }
          Log::Message(LT_WARNING,
                       "Decorator name \'%s\' could not be found in any @decorator rule, declared at %s:%d"
                       ,(key_00->type)._M_dataplus._M_p,pcVar9,uVar10);
        }
      }
      else {
        local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_40;
        local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        local_70 = source;
        (*pDVar4->_vptr_DecoratorInstancer[2])
                  (&local_98,pDVar4,key_00,&key_00->properties,&local_80);
        this_01 = pSStack_90;
        pRVar11 = local_98;
        pSStack_90 = (StyleSheet *)0x0;
        local_98 = (RenderManager *)0x0;
        if (pRVar11 == (RenderManager *)0x0) {
          pcVar9 = "";
          if (source == (PropertySource *)0x0) {
            uVar10 = 0xffffffff;
          }
          else {
            pcVar9 = (source->path)._M_dataplus._M_p;
            uVar10 = (ulong)(uint)source->line_number;
          }
          Log::Message(LT_WARNING,
                       "Decorator \'%s\' in \'%s\' could not be instanced, declared at %s:%d",
                       (key_00->type)._M_dataplus._M_p,(local_48->_M_dataplus)._M_p,pcVar9,uVar10);
        }
      }
      if (pRVar11 == (RenderManager *)0x0) {
        ::std::
        vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
        ::clear(this_00);
      }
      else {
        local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pRVar11;
        local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
        ::std::
        vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
        ::emplace_back<std::shared_ptr<Rml::Decorator_const>>
                  ((vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
                    *)this_00,&local_80);
        if ((StyleSheet *)
            local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (StyleSheet *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_01 = (StyleSheet *)0x0;
      }
      if (this_01 != (StyleSheet *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
    } while ((pRVar11 != (RenderManager *)0x0) && (key_00 = key_00 + 1, key_00 != pDVar3));
  }
LAB_00269718:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
  ::rmlui_nonrecursive_entered = '\0';
  return (DecoratorPtrList *)
         (vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
          *)this_00;
}

Assistant:

const DecoratorPtrList& StyleSheet::InstanceDecorators(RenderManager& render_manager, const DecoratorDeclarationList& declaration_list,
	const PropertySource* source) const
{
	RMLUI_ASSERT_NONRECURSIVE; // Since we may return a reference to the below static variable.
	static DecoratorPtrList non_cached_decorator_list;

	// Empty declaration values are used for interpolated values which we don't want to cache.
	const bool enable_cache = !declaration_list.value.empty();

	// Generate the cache key. Relative paths of textures may be affected by the source path, and ultimately
	// which texture should be displayed. Thus, we need to include this path in the cache key.
	String key;

	if (enable_cache)
	{
		key.reserve(declaration_list.value.size() + 1 + (source ? source->path.size() : 0));
		key = declaration_list.value;
		key += ';';
		if (source)
			key += source->path;

		auto it_cache = decorator_cache.find(key);
		if (it_cache != decorator_cache.end())
			return it_cache->second;
	}
	else
	{
		non_cached_decorator_list.clear();
	}

	DecoratorPtrList& decorators = enable_cache ? decorator_cache[key] : non_cached_decorator_list;
	decorators.reserve(declaration_list.list.size());

	for (const DecoratorDeclaration& declaration : declaration_list.list)
	{
		SharedPtr<Decorator> decorator;

		if (declaration.instancer)
		{
			RMLUI_ZoneScopedN("InstanceDecorator");
			decorator = declaration.instancer->InstanceDecorator(declaration.type, declaration.properties,
				DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
					declaration_list.value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}
		else
		{
			// If we have no instancer, this means the type is the name of an @decorator rule.
			auto it_map = named_decorator_map.find(declaration.type);
			if (it_map != named_decorator_map.end())
				decorator = it_map->second.instancer->InstanceDecorator(it_map->second.type, it_map->second.properties,
					DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator name '%s' could not be found in any @decorator rule, declared at %s:%d",
					declaration.type.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}

		if (!decorator)
		{
			decorators.clear();
			break;
		}

		decorators.push_back(std::move(decorator));
	}

	return decorators;
}